

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_loremaster.cpp
# Opt level: O1

int AF_A_LoremasterChain(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  double dVar1;
  VM_UBYTE VVar2;
  AActor *ent;
  undefined8 *puVar3;
  PClass *pPVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined8 uVar6;
  PClass *pPVar7;
  PClassActor *pPVar8;
  char *__assertion;
  bool bVar9;
  DVector2 v;
  FName local_60;
  undefined4 uStack_5c;
  double dStack_58;
  FSoundID local_4c;
  DVector3 local_48;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005cd9f1;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    ent = (AActor *)(param->field_0).field_1.a;
    if (ent != (AActor *)0x0) {
      if ((ent->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar5 = (**(ent->super_DThinker).super_DObject._vptr_DObject)(ent);
        (ent->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar5);
      }
      pPVar7 = (ent->super_DThinker).super_DObject.Class;
      bVar9 = pPVar7 != (PClass *)0x0;
      if (pPVar7 != pPVar4 && bVar9) {
        do {
          pPVar7 = pPVar7->ParentClass;
          bVar9 = pPVar7 != (PClass *)0x0;
          if (pPVar7 == pPVar4) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if (!bVar9) {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005cd9f1;
      }
    }
    pPVar4 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar2 = param[1].field_0.field_3.Type, VVar2 != 0xff)) {
      if ((VVar2 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005cd9c6;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar6 = (**(code **)*puVar3)(puVar3);
          puVar3[1] = uVar6;
        }
        pPVar7 = (PClass *)puVar3[1];
        bVar9 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar4 && bVar9) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar9 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar4) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (!bVar9) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005cd9f1;
        }
      }
    }
    if (((numparam < 3) || (VVar2 = param[2].field_0.field_3.Type, VVar2 == 0xff)) ||
       ((VVar2 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      local_4c.ID = S_FindSound("loremaster/active");
      S_Sound(ent,4,&local_4c,1.0,1.0);
      local_60.Index = FName::NameManager::FindName(&FName::NameData,"LoreShot2",false);
      local_48.X = (ent->__Pos).X;
      local_48.Y = (ent->__Pos).Y;
      local_48.Z = (ent->__Pos).Z;
      pPVar8 = ClassForSpawn(&local_60);
      AActor::StaticSpawn(pPVar8,&local_48,ALLOW_REPLACE,false);
      iVar5 = FName::NameManager::FindName(&FName::NameData,"LoreShot2",false);
      dVar1 = (ent->Vel).Z;
      P_GetOffsetPosition((ent->__Pos).X,(ent->__Pos).Y,(ent->Vel).X * -0.5,(ent->Vel).Y * -0.5);
      local_48.Z = dVar1 * -0.5 + (ent->__Pos).Z;
      local_48.X = (double)CONCAT44(uStack_5c,local_60.Index);
      local_48.Y = dStack_58;
      local_60.Index = iVar5;
      pPVar8 = ClassForSpawn(&local_60);
      AActor::StaticSpawn(pPVar8,&local_48,ALLOW_REPLACE,false);
      iVar5 = FName::NameManager::FindName(&FName::NameData,"LoreShot2",false);
      dVar1 = (ent->Vel).Z;
      P_GetOffsetPosition((ent->__Pos).X,(ent->__Pos).Y,-(ent->Vel).X,-(ent->Vel).Y);
      local_48.Z = (ent->__Pos).Z - dVar1;
      local_48.X = (double)CONCAT44(uStack_5c,local_60.Index);
      local_48.Y = dStack_58;
      local_60.Index = iVar5;
      pPVar8 = ClassForSpawn(&local_60);
      AActor::StaticSpawn(pPVar8,&local_48,ALLOW_REPLACE,false);
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005cd9c6:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005cd9f1:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_loremaster.cpp"
                ,0x24,"int AF_A_LoremasterChain(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_LoremasterChain)
{
	PARAM_ACTION_PROLOGUE;

	S_Sound (self, CHAN_BODY, "loremaster/active", 1, ATTN_NORM);
	Spawn("LoreShot2", self->Pos(), ALLOW_REPLACE);
	Spawn("LoreShot2", self->Vec3Offset(-self->Vel/2.), ALLOW_REPLACE);
	Spawn("LoreShot2", self->Vec3Offset(-self->Vel), ALLOW_REPLACE);
	return 0;
}